

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ProjectionLight::Projection(ProjectionLight *this,Vector3f *wl,SampledWavelengths *lambda)

{
  array<float,_4> aVar1;
  bool bVar2;
  Float *pFVar3;
  long in_RSI;
  RGBSpectrum *in_RDI;
  undefined1 auVar7 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Point3<float> PVar12;
  SampledSpectrum SVar13;
  int c;
  RGB rgb;
  Point2f st;
  Point3f ps;
  float in_stack_fffffffffffffee8;
  Float in_stack_fffffffffffffeec;
  SampledSpectrum *in_stack_fffffffffffffef0;
  Float a;
  undefined4 in_stack_fffffffffffffef8;
  WrapMode in_stack_fffffffffffffefc;
  Float in_stack_ffffffffffffff0c;
  Image *this_00;
  array<pbrt::WrapMode,_2> wrapMode;
  Tuple2<pbrt::Point2,_float> p;
  SampledWavelengths *lambda_00;
  undefined1 local_c8 [24];
  RGB *in_stack_ffffffffffffff50;
  RGBColorSpace *in_stack_ffffffffffffff58;
  RGBSpectrum *in_stack_ffffffffffffff60;
  int local_80;
  RGB local_7c;
  undefined1 local_70 [8];
  undefined8 local_68;
  Point2<float> local_58 [2];
  float local_48;
  SampledWavelengths local_40;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 extraout_var [56];
  undefined1 auVar8 [56];
  
  if (in_RDI[0xb].rsp.c1 <= *(float *)(in_RSI + 8)) {
    p = (Tuple2<pbrt::Point2,_float>)&in_RDI[0xb].rsp.c2;
    auVar7 = (undefined1  [56])0x0;
    lambda_00 = &local_40;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               in_stack_fffffffffffffee8,0.0);
    PVar12 = Transform::operator()((Transform *)rgb._4_8_,_c);
    local_48 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
    auVar9._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar7;
    local_58[1].super_Tuple2<pbrt::Point2,_float> =
         (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar9._0_16_);
    local_40._12_8_ = local_58[1].super_Tuple2<pbrt::Point2,_float>;
    local_40.pdf.values[1] = local_48;
    Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               in_stack_fffffffffffffee8);
    bVar2 = Inside<float>(local_58,(Bounds2<float> *)&in_RDI[0xb].rgb.g);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this_00 = (Image *)&in_RDI[0xb].rgb.g;
      auVar9 = ZEXT464(0);
      wrapMode.values = (WrapMode  [2])local_70;
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                 in_stack_fffffffffffffee8);
      auVar4._0_8_ = Bounds2<float>::Offset
                               ((Bounds2<float> *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                (Point2<float> *)in_stack_fffffffffffffef0);
      auVar4._8_56_ = extraout_var;
      local_68 = vmovlpd_avx(auVar4._0_16_);
      Point2<float>::Point2<float>
                ((Point2<float> *)in_stack_fffffffffffffef0,
                 (Vector2<float> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      RGB::RGB(&local_7c);
      for (local_80 = 0; auVar7 = auVar9._8_56_, local_80 < 3; local_80 = local_80 + 1) {
        WrapMode2D::WrapMode2D((WrapMode2D *)&in_RDI[3].illuminant,in_stack_fffffffffffffefc);
        in_stack_ffffffffffffff0c =
             Image::LookupNearestChannel
                       (this_00,(Point2f)p,(int)in_stack_ffffffffffffff0c,
                        (WrapMode2D)wrapMode.values);
        pFVar3 = RGB::operator[](&local_7c,local_80);
        *pFVar3 = in_stack_ffffffffffffff0c;
      }
      auVar8 = (undefined1  [56])0x0;
      a = (Float)((ulong)local_c8 >> 0x20);
      RGBSpectrum::RGBSpectrum
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      SVar13 = RGBSpectrum::Sample(in_RDI,lambda_00);
      auVar10._0_8_ = SVar13.values.values._8_8_;
      auVar10._8_56_ = auVar7;
      auVar5._0_8_ = SVar13.values.values._0_8_;
      auVar5._8_56_ = auVar8;
      auVar8 = (undefined1  [56])0x0;
      vmovlpd_avx(auVar5._0_16_);
      vmovlpd_avx(auVar10._0_16_);
      SVar13 = pbrt::operator*(a,(SampledSpectrum *)
                                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      auVar11._0_8_ = SVar13.values.values._8_8_;
      auVar11._8_56_ = auVar7;
      auVar6._0_8_ = SVar13.values.values._0_8_;
      auVar6._8_56_ = auVar8;
      local_10 = vmovlpd_avx(auVar6._0_16_);
      local_8 = vmovlpd_avx(auVar11._0_16_);
    }
    else {
      SampledSpectrum::SampledSpectrum(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    }
  }
  else {
    SampledSpectrum::SampledSpectrum(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

SampledSpectrum ProjectionLight::Projection(const Vector3f &wl,
                                            const SampledWavelengths &lambda) const {
    // Discard directions behind projection light
    if (wl.z < hither)
        return SampledSpectrum(0.);

    // Project point onto projection plane and compute RGB
    Point3f ps = ScreenFromLight(Point3f(wl.x, wl.y, wl.z));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds))
        return SampledSpectrum(0.f);
    Point2f st = Point2f(screenBounds.Offset(Point2f(ps.x, ps.y)));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(st, c);

    return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
}